

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O0

duckdb_logical_type
duckdb_param_logical_type(duckdb_prepared_statement prepared_statement,idx_t param_idx)

{
  bool bVar1;
  __type _Var2;
  pointer this;
  PreparedStatementData *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
  this_01;
  LogicalType *pLVar3;
  long in_RDI;
  iterator it;
  LogicalType param_type;
  string identifier;
  PreparedStatementWrapper *wrapper;
  LogicalType *in_stack_ffffffffffffff28;
  LogicalType *in_stack_ffffffffffffff30;
  LogicalType *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
  local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
  local_98;
  idx_t in_stack_ffffffffffffff70;
  duckdb_prepared_statement in_stack_ffffffffffffff78;
  string local_60 [32];
  string local_40 [56];
  LogicalType *local_8;
  
  if ((in_RDI != 0) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                          *)0x19153e3), bVar1)) {
    this = duckdb::
           unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
           ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                         *)in_stack_ffffffffffffff30);
    bVar1 = duckdb::PreparedStatement::HasError(this);
    if (!bVar1) {
      duckdb_parameter_name_internal_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
      ;
      std::__cxx11::string::string(local_60);
      _Var2 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(local_60);
      if (_Var2) {
        local_8 = (LogicalType *)0x0;
      }
      else {
        duckdb::LogicalType::LogicalType((LogicalType *)0x191548d);
        duckdb::
        unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
        ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                      *)in_stack_ffffffffffffff30);
        this_00 = duckdb::shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                            ((shared_ptr<duckdb::PreparedStatementData,_true> *)
                             in_stack_ffffffffffffff30);
        bVar1 = duckdb::PreparedStatementData::TryGetType
                          (this_00,(string *)
                                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff38);
        if (bVar1) {
          pLVar3 = (LogicalType *)operator_new(0x18);
          duckdb::LogicalType::LogicalType(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          local_8 = pLVar3;
        }
        else {
          this_01._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                       *)in_stack_ffffffffffffff28,(key_type *)0x1915577);
          local_98._M_cur = this_01._M_cur;
          local_a0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                      *)in_stack_ffffffffffffff28);
          bVar1 = std::__detail::operator!=(&local_98,&local_a0);
          if (bVar1) {
            pLVar3 = (LogicalType *)operator_new(0x18);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_false,_true>
            ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_false,_true>
                          *)0x19155c9);
            duckdb::LogicalType::LogicalType((LogicalType *)this_01._M_cur,pLVar3);
            local_8 = pLVar3;
          }
          else {
            local_8 = (LogicalType *)0x0;
          }
        }
        duckdb::LogicalType::~LogicalType((LogicalType *)0x1915628);
      }
      std::__cxx11::string::~string(local_40);
      return (duckdb_logical_type)local_8;
    }
  }
  return (duckdb_logical_type)0x0;
}

Assistant:

duckdb_logical_type duckdb_param_logical_type(duckdb_prepared_statement prepared_statement, idx_t param_idx) {
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared_statement);
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return nullptr;
	}

	auto identifier = duckdb_parameter_name_internal(prepared_statement, param_idx);
	if (identifier == duckdb::string()) {
		return nullptr;
	}

	LogicalType param_type;

	if (wrapper->statement->data->TryGetType(identifier, param_type)) {
		return reinterpret_cast<duckdb_logical_type>(new LogicalType(param_type));
	}
	// The value_map is gone after executing the prepared statement
	// See if this is the case and we still have a value registered for it
	auto it = wrapper->values.find(identifier);
	if (it != wrapper->values.end()) {
		return reinterpret_cast<duckdb_logical_type>(new LogicalType(it->second.return_type));
	}
	return nullptr;
}